

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_fpu_helper.c
# Opt level: O0

void vflr64(S390Vector *v1,S390Vector *v2,CPUS390XState_conflict *env,_Bool s,_Bool XxC,uint8_t erm,
           uintptr_t retaddr)

{
  int old_mode_00;
  float32 data;
  uint64_t a_00;
  uint32_t ret;
  float64 a;
  int old_mode;
  int i;
  S390Vector tmp;
  uint8_t vec_exc;
  uint8_t vxc;
  uint8_t erm_local;
  _Bool XxC_local;
  CPUS390XState_conflict *pCStack_20;
  _Bool s_local;
  CPUS390XState_conflict *env_local;
  S390Vector *v2_local;
  S390Vector *v1_local;
  
  tmp.byte[0xb] = '\0';
  tmp.byte[0xd] = erm;
  tmp.byte[0xe] = XxC;
  tmp.byte[0xf] = s;
  pCStack_20 = env;
  env_local = (CPUS390XState_conflict *)v2;
  v2_local = v1;
  memset(&old_mode,0,0x10);
  old_mode_00 = s390_swap_bfp_rounding_mode(pCStack_20,(uint)tmp.byte[0xd]);
  for (a._4_4_ = 0; a._4_4_ < 2; a._4_4_ = a._4_4_ + 1) {
    a_00 = s390_vec_read_element64((S390Vector *)env_local,(uint8_t)a._4_4_);
    data = float64_to_float32_s390x(a_00,&pCStack_20->fpu_status);
    s390_vec_write_element32((S390Vector *)&old_mode,(uint8_t)(a._4_4_ << 1),data);
    tmp.byte[0xc] =
         check_ieee_exc(pCStack_20,(uint8_t)a._4_4_,(_Bool)(tmp.byte[0xe] & 1),tmp.byte + 0xb);
    if (((tmp.byte[0xf] & 1) != 0) || (tmp.byte[0xc] != '\0')) break;
  }
  s390_restore_bfp_rounding_mode(pCStack_20,old_mode_00);
  handle_ieee_exc(pCStack_20,tmp.byte[0xc],tmp.byte[0xb],retaddr);
  v2_local->doubleword[0] = _old_mode;
  v2_local->doubleword[1] = tmp.doubleword[0];
  return;
}

Assistant:

static void vflr64(S390Vector *v1, const S390Vector *v2, CPUS390XState *env,
                   bool s, bool XxC, uint8_t erm, uintptr_t retaddr)
{
    uint8_t vxc, vec_exc = 0;
    S390Vector tmp = { 0 };
    int i, old_mode;

    old_mode = s390_swap_bfp_rounding_mode(env, erm);
    for (i = 0; i < 2; i++) {
        float64 a = s390_vec_read_element64(v2, i);
        uint32_t ret = float64_to_float32(a, &env->fpu_status);

        /* place at even element */
        s390_vec_write_element32(&tmp, i * 2, ret);
        /* indicate the source element */
        vxc = check_ieee_exc(env, i, XxC, &vec_exc);
        if (s || vxc) {
            break;
        }
    }
    s390_restore_bfp_rounding_mode(env, old_mode);
    handle_ieee_exc(env, vxc, vec_exc, retaddr);
    *v1 = tmp;
}